

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

target_ulong helper_fclass_d_riscv64(uint64_t frs1)

{
  int iVar1;
  int iVar2;
  float_status local_29;
  float_status s;
  _Bool sign;
  float64 f;
  uint64_t frs1_local;
  
  unique0x100000bc = frs1;
  iVar1 = float64_is_neg(frs1);
  s.float_detect_tininess = iVar1 != 0;
  iVar1 = float64_is_infinity(stack0xffffffffffffffe0);
  if (iVar1 == 0) {
    iVar1 = float64_is_zero(stack0xffffffffffffffe0);
    if (iVar1 == 0) {
      iVar1 = float64_is_zero_or_denormal(stack0xffffffffffffffe0);
      if (iVar1 == 0) {
        iVar1 = float64_is_any_nan(stack0xffffffffffffffe0);
        if (iVar1 == 0) {
          iVar1 = 0x40;
          if ((s.float_detect_tininess & 1U) != 0) {
            iVar1 = 2;
          }
          frs1_local = (uint64_t)iVar1;
        }
        else {
          memset(&local_29,0,8);
          iVar1 = float64_is_quiet_nan_riscv64(stack0xffffffffffffffe0,&local_29);
          iVar2 = 0x100;
          if (iVar1 != 0) {
            iVar2 = 0x200;
          }
          frs1_local = (uint64_t)iVar2;
        }
      }
      else {
        iVar1 = 0x20;
        if ((s.float_detect_tininess & 1U) != 0) {
          iVar1 = 4;
        }
        frs1_local = (uint64_t)iVar1;
      }
    }
    else {
      iVar1 = 0x10;
      if ((s.float_detect_tininess & 1U) != 0) {
        iVar1 = 8;
      }
      frs1_local = (uint64_t)iVar1;
    }
  }
  else {
    iVar1 = 0x80;
    if ((s.float_detect_tininess & 1U) != 0) {
      iVar1 = 1;
    }
    frs1_local = (uint64_t)iVar1;
  }
  return frs1_local;
}

Assistant:

target_ulong helper_fclass_d(uint64_t frs1)
{
    float64 f = frs1;
    bool sign = float64_is_neg(f);

    if (float64_is_infinity(f)) {
        return sign ? 1 << 0 : 1 << 7;
    } else if (float64_is_zero(f)) {
        return sign ? 1 << 3 : 1 << 4;
    } else if (float64_is_zero_or_denormal(f)) {
        return sign ? 1 << 2 : 1 << 5;
    } else if (float64_is_any_nan(f)) {
        float_status s = { 0 }; /* for snan_bit_is_one */
        return float64_is_quiet_nan(f, &s) ? 1 << 9 : 1 << 8;
    } else {
        return sign ? 1 << 1 : 1 << 6;
    }
}